

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_parallel.h
# Opt level: O3

void __thiscall highwayhash::ThreadPool::~ThreadPool(ThreadPool *this)

{
  pointer ptVar1;
  _Manager_type p_Var2;
  thread *thread;
  pointer ptVar3;
  
  StartWorkers(this,0xffffffffffffffff);
  ptVar1 = (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (ptVar3 = (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                _M_impl.super__Vector_impl_data._M_start; ptVar3 != ptVar1; ptVar3 = ptVar3 + 1) {
    std::thread::join();
  }
  p_Var2 = (this->task_).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->task_,(_Any_data *)&this->task_,__destroy_functor);
  }
  std::condition_variable::~condition_variable(&this->worker_start_cv_);
  std::condition_variable::~condition_variable(&this->workers_ready_cv_);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&this->threads_);
  return;
}

Assistant:

~ThreadPool() {
    StartWorkers(kWorkerExit);

    for (std::thread& thread : threads_) {
      thread.join();
    }
  }